

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O0

_Bool cmdline_host_ok(Conf *conf)

{
  _Bool _Var1;
  Conf *conf_local;
  
  _Var1 = conf_launchable(conf);
  if (_Var1) {
    if (((seen_hostname_argument & 1U) == 0) && ((loaded_session & 1U) == 0)) {
      conf_local._7_1_ = false;
    }
    else {
      conf_local._7_1_ = true;
    }
  }
  else {
    conf_local._7_1_ = false;
  }
  return conf_local._7_1_;
}

Assistant:

bool cmdline_host_ok(Conf *conf)
{
    /*
     * Return true if the command-line arguments we've processed in
     * TOOLTYPE_HOST_ARG mode are sufficient to justify launching a
     * session.
     */
    assert(cmdline_tooltype & TOOLTYPE_HOST_ARG);

    /*
     * Of course, if we _can't_ launch a session, the answer is
     * clearly no.
     */
    if (!conf_launchable(conf))
        return false;

    /*
     * But also, if we haven't seen either a -load option or a
     * hostname argument, i.e. the only saved settings we've loaded
     * are Default Settings plus any non-hostname-based stuff from the
     * command line, then the answer is still no, _even_ if this Conf
     * is launchable. Otherwise, if you saved your favourite hostname
     * into Default Settings, then just running 'putty' without
     * arguments would connect to it without ever offering you the
     * option to connect to something else or change the setting.
     */
    if (!seen_hostname_argument && !loaded_session)
        return false;

    return true;
}